

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::anon_unknown_0::AtomicMachine::GenShader<int>
          (string *__return_storage_ptr__,AtomicMachine *this,int stage,GLenum internalformat)

{
  ostream *poVar1;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  ostringstream os;
  char local_358 [16];
  char *local_348;
  undefined8 local_340;
  undefined4 local_338;
  uint uStack_334;
  char *local_328;
  undefined8 local_320;
  undefined2 local_318;
  undefined6 uStack_316;
  char *local_308;
  undefined8 local_300;
  undefined4 local_2f8;
  uint uStack_2f4;
  char *local_2e8;
  undefined8 local_2e0;
  undefined2 local_2d8;
  undefined6 uStack_2d6;
  char *local_2c8;
  undefined8 local_2c0;
  undefined4 local_2b8;
  uint uStack_2b4;
  char *local_2a8;
  undefined8 local_2a0;
  undefined2 local_298;
  undefined6 uStack_296;
  char *local_288;
  undefined8 local_280;
  undefined4 local_278;
  uint uStack_274;
  char *local_268;
  undefined8 local_260;
  undefined2 local_258;
  undefined6 uStack_256;
  char *local_248;
  undefined8 local_240;
  undefined4 local_238;
  uint uStack_234;
  char *local_228;
  undefined8 local_220;
  undefined2 local_218;
  undefined6 uStack_216;
  char *local_208;
  undefined8 local_200;
  undefined4 local_1f8;
  uint uStack_1f4;
  char *local_1e8;
  undefined8 local_1e0;
  undefined2 local_1d8;
  undefined6 uStack_1d6;
  char *local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8;
  uint uStack_1b4;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 420 core",0x11);
  uVar3 = (uint)this;
  if (uVar3 == 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\n#extension GL_ARB_compute_shader : require",0x2b);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\nlayout(",8);
  local_248 = (char *)&local_238;
  local_238 = 0x69323372;
  local_240 = 4;
  uStack_234 = uStack_234 & 0xffffff00;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_248,4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") coherent uniform ",0x13);
  local_268 = (char *)&local_258;
  local_258 = 0x69;
  local_260 = 1;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_268,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"image2D g_image_2d;\nlayout(",0x1b);
  local_288 = (char *)&local_278;
  local_278 = 0x69323372;
  local_280 = 4;
  uStack_274 = uStack_274 & 0xffffff00;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_288,4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") coherent uniform ",0x13);
  local_2a8 = (char *)&local_298;
  local_298 = 0x69;
  local_2a0 = 1;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2a8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"image3D g_image_3d;\nlayout(",0x1b);
  local_2c8 = (char *)&local_2b8;
  local_2b8 = 0x69323372;
  local_2c0 = 4;
  uStack_2b4 = uStack_2b4 & 0xffffff00;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2c8,4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") coherent uniform ",0x13);
  local_2e8 = (char *)&local_2d8;
  local_2d8 = 0x69;
  local_2e0 = 1;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2e8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"image2DRect g_image_2drect;\nlayout(",0x23);
  local_308 = (char *)&local_2f8;
  local_2f8 = 0x69323372;
  local_300 = 4;
  uStack_2f4 = uStack_2f4 & 0xffffff00;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_308,4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") coherent uniform ",0x13);
  local_328 = (char *)&local_318;
  local_318 = 0x69;
  local_320 = 1;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_328,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"imageCube g_image_cube;\nlayout(",0x1f)
  ;
  local_348 = (char *)&local_338;
  local_338 = 0x69323372;
  local_340 = 4;
  uStack_334 = uStack_334 & 0xffffff00;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_348,4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") coherent uniform ",0x13);
  local_358[0] = 'i';
  local_358[1] = '\0';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_358,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"imageBuffer g_image_buffer;\nlayout(",0x23);
  local_1b8 = 0x69323372;
  local_1c0 = 4;
  uStack_1b4 = uStack_1b4 & 0xffffff00;
  local_1c8 = (char *)&local_1b8;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1b8,4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") coherent uniform ",0x13);
  local_1d8 = 0x69;
  local_1e0 = 1;
  local_1e8 = (char *)&local_1d8;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1d8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"image1DArray g_image_1darray;\nlayout(",0x25);
  local_1f8 = 0x69323372;
  local_200 = 4;
  uStack_1f4 = uStack_1f4 & 0xffffff00;
  local_208 = (char *)&local_1f8;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1f8,4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") coherent uniform ",0x13);
  local_218 = 0x69;
  local_220 = 1;
  local_228 = (char *)&local_218;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_218,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "image2DArray g_image_2darray;\nlayout(rgba32f) writeonly uniform image2D g_image_result;\nuniform int g_value[6] = int[](0, 1, 2, 3, 4, 5);"
             ,0x89);
  if (local_228 != (char *)&local_218) {
    operator_delete(local_228,CONCAT62(uStack_216,local_218) + 1);
  }
  if (local_208 != (char *)&local_1f8) {
    operator_delete(local_208,CONCAT44(uStack_1f4,local_1f8) + 1);
  }
  if (local_1e8 != (char *)&local_1d8) {
    operator_delete(local_1e8,CONCAT62(uStack_1d6,local_1d8) + 1);
  }
  if (local_1c8 != (char *)&local_1b8) {
    operator_delete(local_1c8,CONCAT44(uStack_1b4,local_1b8) + 1);
  }
  if (local_348 != (char *)&local_338) {
    operator_delete(local_348,CONCAT44(uStack_334,local_338) + 1);
  }
  if (local_328 != (char *)&local_318) {
    operator_delete(local_328,CONCAT62(uStack_316,local_318) + 1);
  }
  if (local_308 != (char *)&local_2f8) {
    operator_delete(local_308,CONCAT44(uStack_2f4,local_2f8) + 1);
  }
  if (local_2e8 != (char *)&local_2d8) {
    operator_delete(local_2e8,CONCAT62(uStack_2d6,local_2d8) + 1);
  }
  if (local_2c8 != (char *)&local_2b8) {
    operator_delete(local_2c8,CONCAT44(uStack_2b4,local_2b8) + 1);
  }
  if (local_2a8 != (char *)&local_298) {
    operator_delete(local_2a8,CONCAT62(uStack_296,local_298) + 1);
  }
  if (local_288 != (char *)&local_278) {
    operator_delete(local_288,CONCAT44(uStack_274,local_278) + 1);
  }
  if (local_268 != (char *)&local_258) {
    operator_delete(local_268,CONCAT62(uStack_256,local_258) + 1);
  }
  if (local_248 != (char *)&local_238) {
    operator_delete(local_248,CONCAT44(uStack_234,local_238) + 1);
  }
  if (uVar3 < 4) {
    pcVar4 = (&PTR_anon_var_dwarf_4d6daa_0212b9d0)[(ulong)this & 0xffffffff];
    lVar2 = *(long *)(&DAT_01ac4d20 + ((ulong)this & 0xffffffff) * 8);
  }
  else {
    if (uVar3 != 4) goto LAB_009d835f;
    lVar2 = 0x67;
    pcVar4 = 
    "\nlayout(local_size_x = 1) in;\nvoid main() {\n  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_value[0]);"
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,lVar2);
LAB_009d835f:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\n  vec4 o_color = vec4(0, 1, 0, 1);\n  imageAtomicExchange(g_image_2d, coord, 0);\n  if (imageAtomicAdd(g_image_2d, coord, 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicMin(g_image_2d, coord, 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicMax(g_image_2d, coord, 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicAnd(g_image_2d, coord, 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicOr(g_image_2d, coord, 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicXor(g_image_2d, coord, 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicExchange(g_image_2d, coord, 1) != 3) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicCompSwap(g_image_2d, coord, 1, 6) != 1) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicExchange(g_image_2d, coord, 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  imageAtomicExchange(g_image_3d, ivec3(coord, 0), 0);\n  if (imageAtomicAdd(g_image_3d, ivec3(coord, 0), 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicMin(g_image_3d, ivec3(coord, 0), 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicMax(g_image_3d, ivec3(coord, g_value[0]), 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicAnd(g_image_3d, ivec3(coord, 0), 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicOr(g_image_3d, ivec3(coord, 0), 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicXor(g_image_3d, ivec3(coord, 0), 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicExchange(g_image_3d, ivec3(coord, 0), 1) != 3) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicCompSwap(g_image_3d, ivec3(coord, 0), 1, 6) != 1) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicExchange(g_image_3d, ivec3(coord, 0), 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  imageAtomicExchange(g_image_2drect, coord, 0);\n  if (imageAtomicAdd(g_image_2drect, coord, 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicMin(g_image_2drect, coord, 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicMax(g..." /* TRUNCATED STRING LITERAL */
             ,0x19ca);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string GenShader(int stage, GLenum internalformat)
	{
		std::ostringstream os;
		os << "#version 420 core";
		if (stage == 4)
		{ // CS
			os << NL "#extension GL_ARB_compute_shader : require";
		}
		os << NL "layout(" << FormatEnumToString(internalformat) << ") coherent uniform " << TypePrefix<T>()
		   << "image2D g_image_2d;" NL "layout(" << FormatEnumToString(internalformat) << ") coherent uniform "
		   << TypePrefix<T>() << "image3D g_image_3d;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") coherent uniform " << TypePrefix<T>() << "image2DRect g_image_2drect;" NL "layout("
		   << FormatEnumToString(internalformat) << ") coherent uniform " << TypePrefix<T>()
		   << "imageCube g_image_cube;" NL "layout(" << FormatEnumToString(internalformat) << ") coherent uniform "
		   << TypePrefix<T>() << "imageBuffer g_image_buffer;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") coherent uniform " << TypePrefix<T>() << "image1DArray g_image_1darray;" NL "layout("
		   << FormatEnumToString(internalformat) << ") coherent uniform " << TypePrefix<T>()
		   << "image2DArray g_image_2darray;" NL "layout(rgba32f) writeonly uniform image2D g_image_result;" NL
			  "uniform int g_value[6] = int[](0, 1, 2, 3, 4, 5);";
		if (stage == 0)
		{ // VS
			os << NL "void main() {" NL "  ivec2 coord = ivec2(gl_VertexID, g_value[0]);";
		}
		else if (stage == 1)
		{ // TCS
			os << NL "layout(vertices = 1) out;" NL "void main() {" NL "  gl_TessLevelInner[0] = 1;" NL
					 "  gl_TessLevelInner[1] = 1;" NL "  gl_TessLevelOuter[0] = 1;" NL "  gl_TessLevelOuter[1] = 1;" NL
					 "  gl_TessLevelOuter[2] = 1;" NL "  gl_TessLevelOuter[3] = 1;" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveID, g_value[0]);";
		}
		else if (stage == 2)
		{ // TES
			os << NL "layout(quads, point_mode) in;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveID, g_value[0]);";
		}
		else if (stage == 3)
		{ // GS
			os << NL "layout(points) in;" NL "layout(points, max_vertices = 1) out;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveIDIn, g_value[0]);";
		}
		else if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = 1) in;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_value[0]);";
		}
		os << NL
			"  vec4 o_color = vec4(0, 1, 0, 1);" NL "  imageAtomicExchange(g_image_2d, coord, 0);" NL
			"  if (imageAtomicAdd(g_image_2d, coord, 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMin(g_image_2d, coord, 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMax(g_image_2d, coord, 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicAnd(g_image_2d, coord, 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicOr(g_image_2d, coord, 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicXor(g_image_2d, coord, 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_2d, coord, 1) != 3) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicCompSwap(g_image_2d, coord, 1, 6) != 1) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_2d, coord, 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);"

			NL "  imageAtomicExchange(g_image_3d, ivec3(coord, 0), 0);" NL
			"  if (imageAtomicAdd(g_image_3d, ivec3(coord, 0), 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMin(g_image_3d, ivec3(coord, 0), 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMax(g_image_3d, ivec3(coord, g_value[0]), 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicAnd(g_image_3d, ivec3(coord, 0), 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicOr(g_image_3d, ivec3(coord, 0), 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicXor(g_image_3d, ivec3(coord, 0), 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_3d, ivec3(coord, 0), 1) != 3) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicCompSwap(g_image_3d, ivec3(coord, 0), 1, 6) != 1) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_3d, ivec3(coord, 0), 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);"

			NL "  imageAtomicExchange(g_image_2drect, coord, 0);" NL
			"  if (imageAtomicAdd(g_image_2drect, coord, 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMin(g_image_2drect, coord, 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMax(g_image_2drect, coord, 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicAnd(g_image_2drect, coord, 0) != g_value[4]) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicOr(g_image_2drect, coord, 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicXor(g_image_2drect, coord, 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_2drect, coord, 1) != 3) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicCompSwap(g_image_2drect, coord, g_value[1], 6) != 1) o_color = vec4(1.0, 0.0, 0.0, "
			"1.0);" NL "  if (imageAtomicExchange(g_image_2drect, coord, 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);"

			NL "  imageAtomicExchange(g_image_cube, ivec3(coord, 0), 0);" NL "  if (imageAtomicAdd(g_image_cube, "
			"ivec3(coord, 0), g_value[2]) != 0) "
			"o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMin(g_image_cube, ivec3(coord, 0), 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMax(g_image_cube, ivec3(coord, 0), 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicAnd(g_image_cube, ivec3(coord, 0), 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicOr(g_image_cube, ivec3(coord, 0), 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicXor(g_image_cube, ivec3(coord, 0), 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_cube, ivec3(coord, 0), 1) != 3) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicCompSwap(g_image_cube, ivec3(coord, g_value[0]), 1, 6) != 1) o_color = vec4(1.0, 0.0, "
			"0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_cube, ivec3(coord, 0), 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);"

			NL "  imageAtomicExchange(g_image_buffer, coord.x, g_value[0]);" NL
			"  if (imageAtomicAdd(g_image_buffer, coord.x, 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMin(g_image_buffer, coord.x, g_value[3]) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMax(g_image_buffer, coord.x, 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicAnd(g_image_buffer, coord.x, 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicOr(g_image_buffer, coord.x, 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicXor(g_image_buffer, coord.x, 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_buffer, coord.x, g_value[1]) != 3) o_color = vec4(1.0, 0.0, 0.0, "
			"1.0);" NL
			"  if (imageAtomicCompSwap(g_image_buffer, coord.x, 1, 6) != 1) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_buffer, coord.x, 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);"

			NL "  imageAtomicExchange(g_image_1darray, ivec2(coord.x, 0), 0);" NL
			"  if (imageAtomicAdd(g_image_1darray, ivec2(coord.x, 0), 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMin(g_image_1darray, ivec2(coord.x, 0), 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMax(g_image_1darray, ivec2(coord.x, g_value[0]), 4) != 2) o_color = vec4(1.0, 0.0, 0.0, "
			"1.0);" NL
			"  if (imageAtomicAnd(g_image_1darray, ivec2(coord.x, 0), 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicOr(g_image_1darray, ivec2(coord.x, 0), 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicXor(g_image_1darray, ivec2(coord.x, 0), 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_1darray, ivec2(coord.x, 0), 1) != 3) o_color = vec4(1.0, 0.0, 0.0, "
			"1.0);" NL "  if (imageAtomicCompSwap(g_image_1darray, ivec2(coord.x, 0), 1, 6) != 1) o_color = vec4(1.0, "
			"0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_1darray, ivec2(coord.x, 0), 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);"

			NL "  imageAtomicExchange(g_image_2darray, ivec3(coord, 0), 0);" NL
			"  if (imageAtomicAdd(g_image_2darray, ivec3(coord, 0), 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMin(g_image_2darray, ivec3(coord, 0), 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMax(g_image_2darray, ivec3(coord, 0), 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicAnd(g_image_2darray, ivec3(coord, 0), 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicOr(g_image_2darray, ivec3(coord, 0), 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicXor(g_image_2darray, ivec3(coord, 0), g_value[4]) != 7) o_color = vec4(1.0, 0.0, 0.0, "
			"1.0);" NL "  if (imageAtomicExchange(g_image_2darray, ivec3(coord, 0), 1) != 3) o_color = vec4(1.0, 0.0, "
			"0.0, 1.0);" NL "  if (imageAtomicCompSwap(g_image_2darray, ivec3(coord, 0), 1, 6) != 1) "
			"o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_2darray, ivec3(coord, 0), 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);"

			NL "  imageStore(g_image_result, coord, o_color);" NL "}";
		return os.str();
	}